

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::destroy_pipeline
          (ConvolutionDepthWise_x86_avx2 *this,Option *opt)

{
  Layer *pLVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  long lVar4;
  
  pLVar1 = this->activation;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
    if (this->activation != (Layer *)0x0) {
      (*this->activation->_vptr_Layer[1])();
    }
    this->activation = (Layer *)0x0;
  }
  ppLVar2 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar3 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3)) {
    lVar4 = 0;
    do {
      (*ppLVar2[lVar4]->_vptr_Layer[5])(ppLVar2[lVar4],opt);
      ppLVar2 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppLVar2[lVar4] != (Layer *)0x0) {
        (*ppLVar2[lVar4]->_vptr_Layer[1])();
        ppLVar2 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      lVar4 = lVar4 + 1;
      ppLVar3 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar4 < (int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3));
  }
  if (ppLVar3 != ppLVar2) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar2;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    for (int i = 0; i < (int)group_ops.size(); i++)
    {
        group_ops[i]->destroy_pipeline(opt);
        delete group_ops[i];
    }
    group_ops.clear();

    return 0;
}